

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O3

bool __thiscall rcg::Stream::getDefinesPayloadsize(Stream *this)

{
  recursive_mutex *__mutex;
  byte bVar1;
  int iVar2;
  undefined8 uVar3;
  bool8_t ret;
  size_t size;
  INFO_DATATYPE type;
  byte local_29;
  size_t local_28;
  INFO_DATATYPE local_1c;
  
  __mutex = &this->mtx;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 != 0) {
    uVar3 = std::__throw_system_error(iVar2);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    _Unwind_Resume(uVar3);
  }
  local_29 = 0;
  local_28 = 1;
  if (this->stream != (DS_HANDLE)0x0) {
    (*((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->DSGetInfo)(this->stream,9,&local_1c,&local_29,&local_28);
  }
  bVar1 = local_29;
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return (bool)(bVar1 & 1);
}

Assistant:

bool Stream::getDefinesPayloadsize()
{
  std::lock_guard<std::recursive_mutex> lock(mtx);
  return getStreamBool(gentl, stream, GenTL::STREAM_INFO_DEFINES_PAYLOADSIZE);
}